

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O1

bool __thiscall
supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::contains
          (KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
          Key<1UL> *key)

{
  char cVar1;
  pointer *__ptr;
  void *local_18;
  char local_10;
  
  (*this->_vptr_KeyValueStorage[1])(&local_18,this,key);
  cVar1 = local_10;
  if ((local_10 == '\x01') && (local_10 = 0, local_18 != (void *)0x0)) {
    operator_delete__(local_18);
  }
  return (bool)cVar1;
}

Assistant:

bool contains(const Key &key) {
        return getValue(key).has_value();
    }